

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O1

void borg_init_3(void)

{
  ushort uVar1;
  _Bool _Var2;
  char *pcVar3;
  char **ppcVar4;
  int16_t *piVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  wchar_t wVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  object hack;
  char buf [256];
  int16_t what [514];
  char *text [514];
  object local_1690;
  char local_1558 [256];
  short local_1458 [520];
  undefined8 local_1048 [515];
  
  borg_items = (borg_item *)
               mem_zalloc(((ulong)z_info->quiver_size + (ulong)z_info->pack_size) * 0x388 + 0x2a60);
  borg_shops = (borg_shop *)mem_zalloc(0x2fb08);
  safe_items = (borg_item *)
               mem_zalloc(((ulong)z_info->quiver_size + (ulong)z_info->pack_size) * 0x388 + 0x2a60);
  safe_home = (borg_item *)mem_zalloc((ulong)z_info->store_inven_max * 0x388);
  safe_shops = (borg_shop *)mem_zalloc(0x2a640);
  wVar9 = L'\0';
  if (1 < z_info->k_max) {
    wVar9 = L'\0';
    uVar11 = 1;
    lVar12 = 0x2a0;
    do {
      if ((*(long *)(k_info->flags + lVar12 + -0x80) != 0) &&
         (*(int *)(k_info->flags + lVar12 + -0x5c) != 0x23)) {
        _Var2 = flag_has_dbg(k_info->kind_flags + lVar12,2,4,"k_ptr->kind_flags","KF_INSTA_ART");
        if (!_Var2) {
          object_prep(&local_1690,(object_kind *)(k_info->flags + lVar12 + -0x80),L'\n',MINIMISE);
          local_1690.number = '\x02';
          object_desc(local_1558,0x100,&local_1690,99,player);
          pcVar3 = string_make(local_1558);
          local_1048[wVar9] = pcVar3;
          local_1458[wVar9] = (short)uVar11;
          wVar9 = wVar9 + L'\x01';
          mem_free(local_1690.brands);
          mem_free(local_1690.slays);
          mem_free(local_1690.curses);
        }
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x2a0;
    } while (uVar11 < z_info->k_max);
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(local_1048,local_1458,wVar9);
  ppcVar4 = (char **)mem_zalloc((ulong)z_info->k_max << 3);
  uVar11 = (ulong)(uint)wVar9;
  borg_sv_plural_text = ppcVar4;
  if (L'\0' < wVar9) {
    uVar8 = 0;
    do {
      ppcVar4[local_1458[uVar8]] = (char *)local_1048[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  borg_plural_size = wVar9;
  borg_plural_text = (char **)mem_zalloc((long)wVar9 << 3);
  piVar5 = (int16_t *)mem_zalloc((long)borg_plural_size * 2);
  ppcVar4 = borg_plural_text;
  borg_plural_what = piVar5;
  if (L'\0' < wVar9) {
    uVar8 = 0;
    do {
      ppcVar4[uVar8] = (char *)local_1048[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  if (L'\0' < wVar9) {
    uVar8 = 0;
    do {
      piVar5[uVar8] = local_1458[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  uVar11 = 0;
  if (1 < z_info->k_max) {
    uVar11 = 0;
    uVar8 = 1;
    lVar12 = 0x2a0;
    do {
      if ((*(long *)(k_info->flags + lVar12 + -0x80) != 0) &&
         (*(int *)(k_info->flags + lVar12 + -0x5c) != 0x23)) {
        _Var2 = flag_has_dbg(k_info->kind_flags + lVar12,2,4,"k_ptr->kind_flags","KF_INSTA_ART");
        if (!_Var2) {
          object_prep(&local_1690,(object_kind *)(k_info->flags + lVar12 + -0x80),L'\0',MINIMISE);
          local_1690.number = '\x01';
          object_desc(local_1558,0x100,&local_1690,99,player);
          pcVar3 = string_make(local_1558);
          iVar10 = (int)uVar11;
          local_1048[iVar10] = pcVar3;
          local_1458[iVar10] = (short)uVar8;
          uVar11 = (ulong)(iVar10 + 1);
          mem_free(local_1690.brands);
          mem_free(local_1690.slays);
          mem_free(local_1690.curses);
        }
      }
      uVar8 = uVar8 + 1;
      lVar12 = lVar12 + 0x2a0;
    } while (uVar8 < z_info->k_max);
  }
  if (1 < z_info->a_max) {
    uVar8 = 1;
    lVar12 = 0x164;
    do {
      pcVar3 = *(char **)(a_info->flags + lVar12 + -0x6c);
      if (pcVar3 != (char *)0x0) {
        wVar9 = borg_lookup_kind(*(wchar_t *)(a_info->flags + lVar12 + -0x4c),
                                 *(wchar_t *)(a_info->flags + lVar12 + -0x48));
        object_prep(&local_1690,k_info + wVar9,L'\n',MINIMISE);
        if (local_1690.known != (object *)0x0) {
          local_1690.number = '\x01';
          object_desc(local_1558,0x100,&local_1690,99,player);
          sVar6 = strlen(pcVar3);
          sVar7 = strlen(local_1558);
          local_1558[sVar7 - (long)((int)sVar6 + 1)] = '\0';
          pcVar3 = string_make(local_1558);
          iVar10 = (int)uVar11;
          local_1048[iVar10] = pcVar3;
          local_1458[iVar10] = (short)wVar9;
          uVar11 = (ulong)(iVar10 + 1);
        }
        mem_free(local_1690.brands);
        mem_free(local_1690.slays);
        mem_free(local_1690.curses);
      }
      uVar8 = uVar8 + 1;
      lVar12 = lVar12 + 0x140;
    } while (uVar8 < z_info->a_max);
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  wVar9 = (wchar_t)uVar11;
  borg_sort(local_1048,local_1458,wVar9);
  borg_single_size = wVar9;
  borg_single_text = (char **)mem_zalloc((long)wVar9 * 8);
  piVar5 = (int16_t *)mem_zalloc((long)borg_single_size * 2);
  ppcVar4 = borg_single_text;
  borg_single_what = piVar5;
  if (L'\0' < wVar9) {
    uVar8 = 0;
    do {
      ppcVar4[uVar8] = (char *)local_1048[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  if (L'\0' < wVar9) {
    uVar8 = 0;
    do {
      piVar5[uVar8] = local_1458[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  uVar1 = z_info->a_max;
  wVar9 = L'\0';
  if (1 < uVar1) {
    uVar11 = 1;
    lVar12 = 0x140;
    wVar9 = L'\0';
    do {
      if (*(long *)(a_info->flags + lVar12 + -0x48) != 0) {
        strnfmt(local_1558,0x100," %s");
        pcVar3 = string_make(local_1558);
        local_1048[wVar9] = pcVar3;
        local_1458[wVar9] = (short)uVar11;
        wVar9 = wVar9 + L'\x01';
      }
      uVar11 = uVar11 + 1;
      uVar1 = z_info->a_max;
      lVar12 = lVar12 + 0x140;
    } while (uVar11 < uVar1);
  }
  ppcVar4 = (char **)mem_zalloc((ulong)uVar1 << 3);
  borg_sv_art_text = ppcVar4;
  if (L'\0' < wVar9) {
    uVar11 = 0;
    do {
      ppcVar4[local_1458[uVar11]] = (char *)local_1048[uVar11];
      uVar11 = uVar11 + 1;
    } while ((uint)wVar9 != uVar11);
  }
  if (1 < z_info->e_max) {
    uVar11 = 1;
    lVar12 = 0x268;
    do {
      if (*(long *)(e_info->flags + lVar12 + -0x20) != 0) {
        strnfmt(local_1558,0x100," %s");
        pcVar3 = string_make(local_1558);
        local_1048[wVar9] = pcVar3;
        local_1458[wVar9] = (short)uVar11 + 0x100;
        wVar9 = wVar9 + L'\x01';
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x260;
    } while (uVar11 < z_info->e_max);
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(local_1048,local_1458,wVar9);
  borg_artego_size = wVar9;
  borg_artego_text = (char **)mem_zalloc((long)wVar9 * 8);
  piVar5 = (int16_t *)mem_zalloc((long)borg_artego_size * 2);
  ppcVar4 = borg_artego_text;
  borg_artego_what = piVar5;
  if (L'\0' < wVar9) {
    uVar11 = 0;
    do {
      ppcVar4[uVar11] = (char *)local_1048[uVar11];
      uVar11 = uVar11 + 1;
    } while ((uint)wVar9 != uVar11);
  }
  if (L'\0' < wVar9) {
    uVar11 = 0;
    do {
      piVar5[uVar11] = local_1458[uVar11];
      uVar11 = uVar11 + 1;
    } while ((uint)wVar9 != uVar11);
  }
  return;
}

Assistant:

void borg_init_3(void)
{
    int     i, k, n;

    int     size;

    int16_t what[514];
    char*   text[514];

    char    buf[256];

    /*** Item/Ware arrays ***/

    /* Make the inventory array */
    borg_items = mem_zalloc(QUIVER_END * sizeof(borg_item));

    /* Make the stores in the town */
    borg_shops = mem_zalloc(9 * sizeof(borg_shop));

    /*** Item/Ware arrays (simulation) ***/

    /* Make the "safe" inventory array */
    safe_items = mem_zalloc(QUIVER_END * sizeof(borg_item));
    safe_home  = mem_zalloc(z_info->store_inven_max * sizeof(borg_item));

    /* Make the "safe" stores in the town */
    safe_shops = mem_zalloc(8 * sizeof(borg_shop));

    /*** Plural Object Templates ***/

    /* Start with no objects */
    size = 0;

    /* Analyze some "item kinds" */
    for (k = 1; k < z_info->k_max; k++) {
        struct object hack;

        /* Get the kind */
        struct object_kind* k_ptr = &k_info[k];

        /* Skip "empty" items */
        if (!k_ptr->name)
            continue;

        /* Skip "gold" objects */
        if (k_ptr->tval == TV_GOLD)
            continue;

        /* Skip "artifacts" */
        if (kf_has(k_ptr->kind_flags, KF_INSTA_ART))
            continue;

        /* Hack -- make an item */
        object_prep(&hack, &k_info[k], 10, MINIMISE);

        /* Describe a "plural" object */
        hack.number = 2;
        object_desc(buf, sizeof(buf), &hack,
            ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, player);

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;

        size++;

        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
    }

    /* Set the sort hooks */
    borg_sort_comp = borg_sort_comp_hook;
    borg_sort_swap = borg_sort_swap_hook;
    /* Sort */
    borg_sort(text, what, size);

    borg_sv_plural_text = mem_zalloc(z_info->k_max * sizeof(char*));
    for (i = 0; i < size; i++)
        borg_sv_plural_text[what[i]] = text[i];

    /* Save the size */
    borg_plural_size = size;

    /* Allocate the "item parsing arrays" (plurals) */
    borg_plural_text = mem_zalloc(borg_plural_size * sizeof(char*));
    borg_plural_what = mem_zalloc(borg_plural_size * sizeof(int16_t));

    /* Save the entries */
    for (i = 0; i < size; i++)
        borg_plural_text[i] = text[i];
    for (i = 0; i < size; i++)
        borg_plural_what[i] = what[i];

    /*** Singular Object Templates ***/

    /* Start with no objects */
    size = 0;

    /* Analyze some "item kinds" */
    for (k = 1; k < z_info->k_max; k++) {
        struct object hack;

        /* Get the kind */
        struct object_kind* k_ptr = &k_info[k];

        /* Skip "empty" items */
        if (!k_ptr->name)
            continue;

        /* Skip "dungeon terrain" objects */
        if (k_ptr->tval == TV_GOLD)
            continue;

        /* Skip "artifacts" */
        if (kf_has(k_ptr->kind_flags, KF_INSTA_ART))
            continue;

        /* Hack -- make an item */
        object_prep(&hack, &k_info[k], 0, MINIMISE);

        /* Describe a "singular" object */
        hack.number = 1;
        object_desc(buf, sizeof(buf), &hack,
            ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, player);

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;
        size++;

        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
    }

    /* Analyze the "INSTA_ART" items */
    for (i = 1; i < z_info->a_max; i++) {
        struct object    hack;

        struct artifact* a_ptr = &a_info[i];

        char*            name = (a_ptr->name);

        /* Skip "empty" items */
        if (!a_ptr->name)
            continue;

        /* Extract the k"ind" */
        k = borg_lookup_kind(a_ptr->tval, a_ptr->sval);

        /* Hack -- make an item */
        object_prep(&hack, &k_info[k], 10, MINIMISE);

        if (!hack.known) {
            mem_free(hack.brands);
            mem_free(hack.slays);
            mem_free(hack.curses);
            continue;
        }

        /* Save the index */
        /* hack.name1 = i; */

        /* Describe a "singular" object */
        hack.number = 1;
        object_desc(buf, sizeof(buf), &hack,
            ODESC_PREFIX | ODESC_FULL | ODESC_SPOIL, player);

        /* Extract the "suffix" length */
        n = strlen(name) + 1;

        /* Remove the "suffix" */
        buf[strlen(buf) - n] = '\0';

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;
        size++;

        mem_free(hack.brands);
        mem_free(hack.slays);
        mem_free(hack.curses);
    }

    /* Set the sort hooks */
    borg_sort_comp = borg_sort_comp_hook;
    borg_sort_swap = borg_sort_swap_hook;
    /* Sort */
    borg_sort(text, what, size);

    /* Save the size */
    borg_single_size = size;

    /* Allocate the "item parsing arrays" (plurals) */
    borg_single_text = mem_zalloc(borg_single_size * sizeof(char*));
    borg_single_what = mem_zalloc(borg_single_size * sizeof(int16_t));

    /* Save the entries */
    for (i = 0; i < size; i++)
        borg_single_text[i] = text[i];
    for (i = 0; i < size; i++)
        borg_single_what[i] = what[i];

    /*** Artifact and Ego-Item Parsers ***/

    /* No entries yet */
    size = 0;

    /* Collect the "artifact names" */
    for (k = 1; k < z_info->a_max; k++) {
        struct artifact* a_ptr = &a_info[k];

        /* Skip non-items */
        if (!a_ptr->name)
            continue;

        /* Extract a string */
        strnfmt(buf, sizeof(buf), " %s", (a_ptr->name));

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k;
        size++;
    }

    borg_sv_art_text = mem_zalloc(z_info->a_max * sizeof(char*));
    for (i = 0; i < size; i++)
        borg_sv_art_text[what[i]] = text[i];

    /* Collect the "ego-item names" */
    for (k = 1; k < z_info->e_max; k++) {
        struct ego_item* e_ptr = &e_info[k];

        /* Skip non-items */
        if (!e_ptr->name)
            continue;

        /* Extract a string */
        strnfmt(buf, sizeof(buf), " %s", (e_ptr->name));

        /* Save an entry */
        text[size] = string_make(buf);
        what[size] = k + 256;
        size++;
    }
    /* Set the sort hooks */
    borg_sort_comp = borg_sort_comp_hook;
    borg_sort_swap = borg_sort_swap_hook;

    /* Sort */
    borg_sort(text, what, size);

    /* Save the size */
    borg_artego_size = size;

    /* Allocate the "item parsing arrays" (plurals) */
    borg_artego_text = mem_zalloc(borg_artego_size * sizeof(char*));
    borg_artego_what = mem_zalloc(borg_artego_size * sizeof(int16_t));

    /* Save the entries */
    for (i = 0; i < size; i++)
        borg_artego_text[i] = text[i];
    for (i = 0; i < size; i++)
        borg_artego_what[i] = what[i];
}